

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopPeeling::GetIteratingExitValues(LoopPeeling *this)

{
  IRContext *pIVar1;
  CFG *this_00;
  BasicBlock *pBVar2;
  uint uVar3;
  char cVar4;
  uint32_t uVar5;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var7;
  IRContext *pIVar8;
  mapped_type *ppBVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  bool bVar12;
  uint32_t condition_block_id;
  uint local_8c;
  LoopPeeling **local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  Instruction *local_60;
  LoopPeeling *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  this_00 = (pIVar1->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_88 = &local_58;
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:256:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:256:7)>
             ::_M_manager;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar10 = (this->loop_->loop_header_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_58 = this;
  if ((pIVar10 != (Instruction *)0x0) &&
     ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar10 == (Instruction *)0x0) break;
      pIVar11 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar4 = '\0';
      if ((pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar11 = (Instruction *)0x0;
      }
      if (pIVar10->opcode_ == OpPhi) {
        local_60 = pIVar10;
        if (local_78 == (code *)0x0) goto LAB_0024e866;
        cVar4 = (*pcStack_70)(&local_88);
        if (cVar4 != '\0') {
          pIVar10 = pIVar11;
        }
      }
    } while (cVar4 != '\0');
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  pBVar2 = this->loop_->loop_merge_;
  if (pBVar2 != (BasicBlock *)0x0) {
    pIVar10 = (pBVar2->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar5 = 0;
    if (pIVar10->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
    }
    pvVar6 = CFG::preds(this_00,uVar5);
    if ((long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start == 4) {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      pIVar1 = (IRContext *)
               (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      pIVar10 = (this->loop_->loop_merge_->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      blk_id = 0;
      uVar5 = 0;
      if (pIVar10->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      pvVar6 = CFG::preds(this_00,uVar5);
      local_8c = *(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      pIVar10 = (this->loop_->loop_header_->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar10->has_result_id_ == true) {
        blk_id = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      pvVar6 = CFG::preds(this_00,blk_id);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish,&local_8c);
      uVar3 = local_8c;
      bVar12 = _Var7._M_current ==
               (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      this->do_while_form_ = !bVar12;
      if (bVar12) {
        pIVar8 = (IRContext *)
                 IRContext::GetDominatorAnalysis(this->context_,(this->loop_utils_).function_);
        local_88 = (LoopPeeling **)CONCAT44(local_88._4_4_,local_8c);
        ppBVar9 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&this_00->id2block_,(key_type *)&local_88);
        pIVar1 = (IRContext *)*ppBVar9;
        pBVar2 = this->loop_->loop_header_;
        local_48 = (code *)0x0;
        pcStack_40 = (code *)0x0;
        local_58 = (LoopPeeling *)0x0;
        uStack_50 = 0;
        local_58 = (LoopPeeling *)operator_new(0x18);
        local_58->context_ = pIVar8;
        (local_58->loop_utils_).context_ = pIVar1;
        (local_58->loop_utils_).loop_desc_ = (LoopDescriptor *)this;
        pcStack_40 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:290:9)>
                     ::_M_invoke;
        local_48 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:290:9)>
                   ::_M_manager;
        uStack_80 = 0;
        local_88 = &local_58;
        pcStack_70 = std::
                     _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                   ::_M_manager;
        pIVar10 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar10 != (Instruction *)0x0) &&
           ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
          do {
            if (pIVar10 == (Instruction *)0x0) break;
            pIVar11 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            cVar4 = '\0';
            if ((pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false
               ) {
              pIVar11 = (Instruction *)0x0;
            }
            if (pIVar10->opcode_ == OpPhi) {
              local_60 = pIVar10;
              if (local_78 == (code *)0x0) goto LAB_0024e866;
              cVar4 = (*pcStack_70)(&local_88,&local_60);
              if (cVar4 != '\0') {
                pIVar10 = pIVar11;
              }
            }
          } while (cVar4 != '\0');
        }
      }
      else {
        pBVar2 = this->loop_->loop_header_;
        local_58 = (LoopPeeling *)0x0;
        uStack_50 = 0;
        local_48 = (code *)0x0;
        pcStack_40 = (code *)0x0;
        local_58 = (LoopPeeling *)operator_new(0x18);
        *(uint *)&local_58->context_ = uVar3;
        (local_58->loop_utils_).context_ = pIVar1;
        (local_58->loop_utils_).loop_desc_ = (LoopDescriptor *)this;
        pcStack_40 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:273:9)>
                     ::_M_invoke;
        local_48 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:273:9)>
                   ::_M_manager;
        uStack_80 = 0;
        local_88 = &local_58;
        pcStack_70 = std::
                     _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                   ::_M_manager;
        pIVar10 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar10 != (Instruction *)0x0) &&
           ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
          do {
            if (pIVar10 == (Instruction *)0x0) break;
            pIVar11 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            cVar4 = '\0';
            if ((pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false
               ) {
              pIVar11 = (Instruction *)0x0;
            }
            if (pIVar10->opcode_ == OpPhi) {
              local_60 = pIVar10;
              if (local_78 == (code *)0x0) {
LAB_0024e866:
                std::__throw_bad_function_call();
              }
              cVar4 = (*pcStack_70)(&local_88,&local_60);
              if (cVar4 != '\0') {
                pIVar10 = pIVar11;
              }
            }
          } while (cVar4 != '\0');
        }
      }
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,3);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
    }
  }
  return;
}

Assistant:

void LoopPeeling::GetIteratingExitValues() {
  CFG& cfg = *context_->cfg();

  loop_->GetHeaderBlock()->ForEachPhiInst(
      [this](Instruction* phi) { exit_value_[phi->result_id()] = nullptr; });

  if (!loop_->GetMergeBlock()) {
    return;
  }
  if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
    return;
  }
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

  auto& header_pred = cfg.preds(loop_->GetHeaderBlock()->id());
  do_while_form_ = std::find(header_pred.begin(), header_pred.end(),
                             condition_block_id) != header_pred.end();
  if (do_while_form_) {
    loop_->GetHeaderBlock()->ForEachPhiInst(
        [condition_block_id, def_use_mgr, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            if (condition_block_id == phi->GetSingleWordInOperand(i + 1)) {
              exit_value_[phi->result_id()] =
                  def_use_mgr->GetDef(phi->GetSingleWordInOperand(i));
            }
          }
        });
  } else {
    DominatorTree* dom_tree =
        &context_->GetDominatorAnalysis(loop_utils_.GetFunction())
             ->GetDomTree();
    BasicBlock* condition_block = cfg.block(condition_block_id);

    loop_->GetHeaderBlock()->ForEachPhiInst(
        [dom_tree, condition_block, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          // Not the back-edge value, check if the phi instruction is the only
          // possible candidate.
          GetIteratorUpdateOperations(loop_, phi, &operations);

          for (Instruction* insn : operations) {
            if (insn == phi) {
              continue;
            }
            if (dom_tree->Dominates(context_->get_instr_block(insn),
                                    condition_block)) {
              return;
            }
          }
          exit_value_[phi->result_id()] = phi;
        });
  }
}